

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkparse.c
# Opt level: O1

int pk_use_ecparams(mbedtls_asn1_buf *params,mbedtls_ecp_group *grp)

{
  mbedtls_ecp_group_id *pmVar1;
  mbedtls_mpi *X;
  long lVar2;
  int iVar3;
  int iVar4;
  mbedtls_ecp_group_id *pmVar5;
  mbedtls_ecp_group_id *pmVar6;
  size_t sVar7;
  byte *pbVar8;
  byte *end;
  mbedtls_ecp_group_id grp_id;
  uchar *p;
  mbedtls_ecp_group_id local_240;
  undefined4 uStack_23c;
  mbedtls_ecp_group *local_238;
  int local_230;
  int local_22c;
  mbedtls_mpi *local_228;
  mbedtls_ecp_group local_220;
  mbedtls_ecp_group local_128;
  
  if (params->tag == 6) {
    iVar3 = mbedtls_oid_get_ec_grp(params,&local_240);
    iVar4 = -0x3a00;
    goto joined_r0x0014698d;
  }
  mbedtls_ecp_group_init(&local_128);
  local_220._0_8_ = params->p;
  end = (byte *)(local_220._0_8_ + params->len);
  iVar4 = mbedtls_asn1_get_int((uchar **)&local_220,end,&local_22c);
  if (iVar4 != 0) goto LAB_001467ad;
  if (local_22c - 4U < 0xfffffffd) {
    iVar4 = -0x3d00;
  }
  else {
    iVar4 = mbedtls_asn1_get_tag((uchar **)&local_220,end,(size_t *)&local_240,0x30);
    if (iVar4 == 0) {
      pbVar8 = (byte *)(local_220._0_8_ + CONCAT44(uStack_23c,local_240));
      iVar4 = mbedtls_asn1_get_tag((uchar **)&local_220,pbVar8,(size_t *)&local_240,6);
      if (((iVar4 == 0) && (iVar4 = -0x3980, CONCAT44(uStack_23c,local_240) == 7)) &&
         (*(int *)(local_220._0_8_ + 3) == 0x1013dce && *(int *)local_220._0_8_ == -0x31b779d6)) {
        local_220._0_8_ = local_220._0_8_ + 7;
        X = &local_128.P;
        iVar4 = mbedtls_asn1_get_mpi((uchar **)&local_220,pbVar8,X);
        if (iVar4 == 0) {
          local_128.pbits = mbedtls_mpi_bitlen(X);
          iVar4 = -0x3d66;
          if (((byte *)local_220._0_8_ == pbVar8) &&
             (iVar4 = mbedtls_asn1_get_tag((uchar **)&local_220,end,(size_t *)&local_240,0x30),
             iVar4 == 0)) {
            pbVar8 = (byte *)(local_220._0_8_ + CONCAT44(uStack_23c,local_240));
            iVar4 = mbedtls_asn1_get_tag((uchar **)&local_220,pbVar8,(size_t *)&local_240,4);
            if ((iVar4 != 0) ||
               (local_238 = grp,
               iVar4 = mbedtls_mpi_read_binary
                                 (&local_128.A,(uchar *)local_220._0_8_,
                                  CONCAT44(uStack_23c,local_240)), grp = local_238, iVar4 != 0))
            goto LAB_001467ad;
            local_220._0_8_ = local_220._0_8_ + CONCAT44(uStack_23c,local_240);
            iVar4 = mbedtls_asn1_get_tag((uchar **)&local_220,pbVar8,(size_t *)&local_240,4);
            if ((iVar4 == 0) &&
               (iVar4 = mbedtls_mpi_read_binary
                                  (&local_128.B,(uchar *)local_220._0_8_,
                                   CONCAT44(uStack_23c,local_240)), iVar4 == 0)) {
              local_220._0_8_ = local_220._0_8_ + CONCAT44(uStack_23c,local_240);
              iVar4 = mbedtls_asn1_get_tag((uchar **)&local_220,pbVar8,(size_t *)&local_240,3);
              if (iVar4 == 0) {
                local_220._0_8_ = local_220._0_8_ + CONCAT44(uStack_23c,local_240);
              }
              grp = local_238;
              iVar4 = -0x3d66;
              if ((byte *)local_220._0_8_ != pbVar8) goto LAB_0014680a;
              iVar4 = mbedtls_asn1_get_tag((uchar **)&local_220,end,(size_t *)&local_240,4);
              if (iVar4 == 0) {
                iVar4 = mbedtls_ecp_point_read_binary
                                  (&local_128,&local_128.G,(uchar *)local_220._0_8_,
                                   CONCAT44(uStack_23c,local_240));
                if (iVar4 == 0) {
LAB_00146c11:
                  local_220._0_8_ = local_220._0_8_ + CONCAT44(uStack_23c,local_240);
                  iVar4 = mbedtls_asn1_get_mpi((uchar **)&local_220,end,&local_128.N);
                  if (iVar4 != 0) goto LAB_00146aef;
                  local_128.nbits = mbedtls_mpi_bitlen(&local_128.N);
                  iVar4 = 0;
                  grp = local_238;
                }
                else if ((((iVar4 == -0x4e80) && ((*(byte *)local_220._0_8_ & 0xfe) == 2)) &&
                         (lVar2 = CONCAT44(uStack_23c,local_240), sVar7 = mbedtls_mpi_size(X),
                         lVar2 == sVar7 + 1)) &&
                        ((iVar4 = mbedtls_mpi_read_binary
                                            (&local_128.G.X,(byte *)(local_220._0_8_ + 1),
                                             CONCAT44(uStack_23c,local_240) - 1), iVar4 == 0 &&
                         (iVar4 = mbedtls_mpi_lset(&local_128.G.Y,
                                                   (ulong)*(byte *)local_220._0_8_ - 2), iVar4 == 0)
                         ))) {
                  iVar3 = mbedtls_mpi_lset(&local_128.G.Z,1);
                  iVar4 = -0x3d00;
                  grp = local_238;
                  if (iVar3 == 0) goto LAB_00146c11;
                }
                else {
                  iVar4 = -0x3d00;
                  grp = local_238;
                }
                goto LAB_0014680a;
              }
            }
LAB_00146aef:
            iVar4 = iVar4 + -0x3d00;
            grp = local_238;
          }
        }
        else {
LAB_001467ad:
          iVar4 = iVar4 + -0x3d00;
        }
      }
    }
  }
LAB_0014680a:
  if (iVar4 == 0) {
    local_238 = grp;
    mbedtls_ecp_group_init(&local_220);
    pmVar5 = mbedtls_ecp_grp_id_list();
    iVar4 = 0;
    if (*pmVar5 != MBEDTLS_ECP_DP_NONE) {
      local_228 = &local_128.N;
      pmVar6 = pmVar5;
      do {
        mbedtls_ecp_group_free(&local_220);
        iVar4 = mbedtls_ecp_group_load(&local_220,*pmVar6);
        pmVar5 = pmVar6;
        if (iVar4 != 0) break;
        if ((((local_128.pbits == local_220.pbits) && (local_128.nbits == local_220.nbits)) &&
            ((iVar4 = mbedtls_mpi_cmp_mpi(&local_128.P,(mbedtls_mpi *)((long)&local_220 + 8)),
             iVar4 == 0 &&
             (((iVar4 = mbedtls_mpi_cmp_mpi(&local_128.A,&local_220.A), iVar4 == 0 &&
               (iVar4 = mbedtls_mpi_cmp_mpi(&local_128.B,&local_220.B), iVar4 == 0)) &&
              (iVar4 = mbedtls_mpi_cmp_mpi(local_228,&local_220.N), iVar4 == 0)))))) &&
           ((iVar4 = mbedtls_mpi_cmp_mpi(&local_128.G.X,&local_220.G.X), iVar4 == 0 &&
            (iVar4 = mbedtls_mpi_cmp_mpi(&local_128.G.Z,&local_220.G.Z), iVar4 == 0)))) {
          local_230 = mbedtls_mpi_get_bit(&local_128.G.Y,0);
          iVar4 = mbedtls_mpi_get_bit(&local_220.G.Y,0);
          if (local_230 == iVar4) {
            iVar4 = 0;
            break;
          }
        }
        pmVar5 = pmVar6 + 1;
        pmVar1 = pmVar6 + 1;
        pmVar6 = pmVar5;
        iVar4 = 0;
      } while (*pmVar1 != MBEDTLS_ECP_DP_NONE);
    }
    mbedtls_ecp_group_free(&local_220);
    local_240 = *pmVar5;
    grp = local_238;
    if (iVar4 == 0) {
      iVar4 = -0x4e80;
      if (*pmVar5 != MBEDTLS_ECP_DP_NONE) {
        iVar4 = 0;
      }
    }
  }
  mbedtls_ecp_group_free(&local_128);
  iVar3 = iVar4;
joined_r0x0014698d:
  if ((iVar3 == 0) && (iVar4 = -0x3d00, grp->id == local_240 || grp->id == MBEDTLS_ECP_DP_NONE)) {
    iVar4 = mbedtls_ecp_group_load(grp,local_240);
  }
  return iVar4;
}

Assistant:

static int pk_use_ecparams( const mbedtls_asn1_buf *params, mbedtls_ecp_group *grp )
{
    int ret;
    mbedtls_ecp_group_id grp_id;

    if( params->tag == MBEDTLS_ASN1_OID )
    {
        if( mbedtls_oid_get_ec_grp( params, &grp_id ) != 0 )
            return( MBEDTLS_ERR_PK_UNKNOWN_NAMED_CURVE );
    }
    else
    {
#if defined(MBEDTLS_PK_PARSE_EC_EXTENDED)
        if( ( ret = pk_group_id_from_specified( params, &grp_id ) ) != 0 )
            return( ret );
#else
        return( MBEDTLS_ERR_PK_KEY_INVALID_FORMAT );
#endif
    }

    /*
     * grp may already be initilialized; if so, make sure IDs match
     */
    if( grp->id != MBEDTLS_ECP_DP_NONE && grp->id != grp_id )
        return( MBEDTLS_ERR_PK_KEY_INVALID_FORMAT );

    if( ( ret = mbedtls_ecp_group_load( grp, grp_id ) ) != 0 )
        return( ret );

    return( 0 );
}